

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c++
# Opt level: O1

void __thiscall
kj::ExceptionSafeArrayUtil::construct
          (ExceptionSafeArrayUtil *this,size_t count,_func_void_void_ptr *constructElement)

{
  if (count != 0) {
    do {
      (*constructElement)(this->pos);
      this->pos = this->pos + this->elementSize;
      this->constructedElementCount = this->constructedElementCount + 1;
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

void ExceptionSafeArrayUtil::construct(size_t count, void (*constructElement)(void*)) {
  while (count > 0) {
    constructElement(pos);
    pos += elementSize;
    ++constructedElementCount;
    --count;
  }
}